

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

string * __thiscall
kws::Parser::GetLine_abi_cxx11_(string *__return_storage_ptr__,Parser *this,unsigned_long i)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  
  psVar1 = &this->m_Buffer;
  uVar2 = std::__cxx11::string::find((char *)psVar1,0x169502,0);
  uVar5 = 0;
  if (uVar2 != 0xffffffffffffffff) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = uVar2;
      if ((i == uVar5) && (~uVar4 + uVar3 != 0)) goto LAB_00121d33;
      uVar5 = uVar5 + 1;
      uVar2 = std::__cxx11::string::find((char *)psVar1,0x169502,uVar3 + 1);
      uVar4 = uVar3;
    } while (uVar2 != 0xffffffffffffffff);
  }
  if (uVar5 == i) {
LAB_00121d33:
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar1);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::GetLine(unsigned long i) const
{
 unsigned long lines = 0;
 size_t prec = 0;
 auto pos = m_Buffer.find("\n", 0);
 while(pos != std::string::npos)
   {
   if(lines == i)
     {
     if(pos-prec-1>0)
       {
       return m_Buffer.substr(prec,pos-prec-1);
       }
     }
   lines++;
   prec = pos;
   pos = m_Buffer.find("\n",pos+1);
   }

  if(lines == i)
    {
    return m_Buffer.substr(prec,m_Buffer.size()-prec);
    }

 return "";
}